

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  undefined1 *puVar1;
  int iVar2;
  ulong uVar3;
  code *pcVar4;
  long lVar5;
  secp256k1_scalar *ng;
  secp256k1_scalar *psVar6;
  size_t sVar7;
  secp256k1_gej *r_00;
  ulong uVar8;
  secp256k1_sha256 *psVar9;
  secp256k1_scratch *scratch_00;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_sha256 *psVar10;
  size_t size;
  secp256k1_scalar zero;
  uchar bytes [65];
  secp256k1_ge r;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  ulong uStack_1410;
  secp256k1_strauss_state sStack_1408;
  secp256k1_fe asStack_13f0 [8];
  secp256k1_strauss_point_state sStack_12b0;
  secp256k1_ge asStack_ea0 [8];
  size_t *psStack_bd8;
  secp256k1_gej *psStack_bd0;
  secp256k1_gej *psStack_bc8;
  secp256k1_sha256 *psStack_bc0;
  secp256k1_gej *psStack_bb8;
  secp256k1_strauss_point_state *psStack_bb0;
  size_t local_b90;
  secp256k1_scalar local_b88;
  secp256k1_scratch local_b68 [2];
  secp256k1_ge local_b20;
  secp256k1_gej local_ac8;
  secp256k1_gej local_a48;
  secp256k1_gej local_9c8;
  secp256k1_gej local_948;
  secp256k1_gej local_8c8;
  secp256k1_gej local_848 [2];
  secp256k1_gej local_708 [5];
  secp256k1_strauss_point_state local_448;
  
  local_b88.d[2] = 0;
  local_b88.d[3] = 0;
  local_b88.d[0] = 0;
  local_b88.d[1] = 0;
  local_b90 = 0x41;
  local_8c8.infinity = 0;
  local_8c8.x.n[0] = 0x2815b16f81798;
  local_8c8.x.n[1] = 0xdb2dce28d959f;
  local_8c8.x.n[2] = 0xe870b07029bfc;
  local_8c8.x.n[3] = 0xbbac55a06295c;
  local_8c8.x.n[4] = 0x79be667ef9dc;
  local_8c8.y.n[4] = 0x483ada7726a3;
  local_8c8.y.n[0] = 0x7d08ffb10d4b8;
  local_8c8.y.n[1] = 0x48a68554199c4;
  local_8c8.y.n[2] = 0xe1108a8fd17b4;
  local_8c8.y.n[3] = 0xc4655da4fbfc0;
  local_8c8.z.n[0] = 1;
  local_8c8.z.n[3] = 0;
  local_8c8.z.n[4] = 0;
  local_8c8.z.n[1] = 0;
  local_8c8.z.n[2] = 0;
  local_948.infinity = 1;
  local_948.z.n[4] = 0;
  local_948.z.n[2] = 0;
  local_948.z.n[3] = 0;
  local_948.z.n[0] = 0;
  local_948.z.n[1] = 0;
  local_948.y.n[3] = 0;
  local_948.y.n[4] = 0;
  local_948.y.n[1] = 0;
  local_948.y.n[2] = 0;
  local_948.x.n[4] = 0;
  local_948.y.n[0] = 0;
  local_948.x.n[2] = 0;
  local_948.x.n[3] = 0;
  local_948.x.n[0] = 0;
  local_948.x.n[1] = 0;
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163571;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9c8,x);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x1635bc;
  local_ac8.x.n[0] = (uint64_t)local_848;
  local_ac8.x.n[1] = (uint64_t)local_708;
  local_ac8.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_ac8,&local_a48,1,&local_8c8,x,&local_b88);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x1635ed;
  local_b20.x.n[0] = (uint64_t)local_848;
  local_b20.x.n[1] = (uint64_t)local_708;
  local_b20.x.n[2] = (uint64_t)&local_448;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_b20,&local_ac8,1,&local_948,&local_b88,x);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163616;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&local_448,x,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163641;
  cbdata = x;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,local_708,&local_b88,test_ecmult_accumulate_cb,x,1);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x16365b;
  secp256k1_ecmult_const(local_848,&secp256k1_ge_const_g,x);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163673;
  secp256k1_ge_set_gej_var(&local_b20,&local_9c8);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163683;
  ge_equals_gej(&local_b20,&local_a48);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x16368e;
  ge_equals_gej(&local_b20,&local_ac8);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163699;
  ge_equals_gej(&local_b20,(secp256k1_gej *)&local_448);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x1636a4;
  ge_equals_gej(&local_b20,local_708);
  psStack_bb0 = (secp256k1_strauss_point_state *)0x1636af;
  ge_equals_gej(&local_b20,local_848);
  if (local_b20.infinity == 0) {
    elem = &local_b20;
    scratch_00 = local_b68;
    ng = (secp256k1_scalar *)0x0;
    psStack_bb0 = (secp256k1_strauss_point_state *)0x1636eb;
    secp256k1_eckey_pubkey_serialize(elem,scratch_00->magic,&local_b90,0);
    if (local_b90 != 0x41) {
      psStack_bb0 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      r_00->infinity = 1;
      (r_00->x).n[0] = 0;
      (r_00->x).n[1] = 0;
      (r_00->x).n[2] = 0;
      (r_00->x).n[3] = 0;
      (r_00->x).n[4] = 0;
      (r_00->y).n[0] = 0;
      (r_00->y).n[1] = 0;
      (r_00->y).n[2] = 0;
      (r_00->y).n[3] = 0;
      (r_00->y).n[4] = 0;
      (r_00->z).n[0] = 0;
      (r_00->z).n[1] = 0;
      (r_00->z).n[2] = 0;
      (r_00->z).n[3] = 0;
      (r_00->z).n[4] = 0;
      if (ng != (secp256k1_scalar *)0x0 || acc != (secp256k1_sha256 *)0x0) {
        psStack_bd8 = &local_b90;
        psStack_bd0 = &local_ac8;
        psStack_bc8 = local_708;
        psStack_bc0 = acc;
        psStack_bb8 = local_848;
        psStack_bb0 = &local_448;
        if (acc == (secp256k1_sha256 *)0x0) {
          sStack_1408.aux = asStack_13f0;
          sStack_1408.pre_a = asStack_ea0;
          sStack_1408.ps = &sStack_12b0;
          secp256k1_ecmult_strauss_wnaf(&sStack_1408,r_00,1,r_00,&secp256k1_scalar_zero,ng);
        }
        else {
          if ((scratch_00 == (secp256k1_scratch *)0x0) ||
             (sVar7 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,scratch_00),
             sVar7 == 0)) {
LAB_0016396f:
            secp256k1_ecmult_multi_simple_var(r_00,ng,cb,cbdata,(size_t)acc);
            return;
          }
          uVar3 = 5000000;
          if (sVar7 < 5000000) {
            uVar3 = sVar7;
          }
          puVar1 = (undefined1 *)((long)&acc[-1].bytes + 7);
          uStack_1410 = (ulong)puVar1 / uVar3 + 1;
          uVar3 = (ulong)puVar1 / uStack_1410;
          if (uVar3 < 0x57) {
            lVar5 = 0;
            do {
              if (scratch_00->magic[lVar5] != "scratch"[lVar5]) {
                (*(code *)(elem->x).n[0])("invalid scratch space",(elem->x).n[1]);
                goto LAB_0016396f;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 8);
            uVar8 = scratch_00->max_size - scratch_00->alloc_size;
            uVar3 = 0;
            if (0x4a < uVar8) {
              uVar3 = uVar8 - 0x4b;
            }
            if (uVar3 < 0x8b0) goto LAB_0016396f;
            uVar3 = uVar3 / 0x8b0;
            if (4999999 < uVar3) {
              uVar3 = 5000000;
            }
            uStack_1410 = (ulong)puVar1 / uVar3 + 1;
            uVar3 = (ulong)puVar1 / uStack_1410;
            pcVar4 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar4 = secp256k1_ecmult_pippenger_batch;
          }
          psVar10 = (secp256k1_sha256 *)(uVar3 + 1);
          lVar5 = 0;
          uVar3 = 0;
          do {
            psVar9 = psVar10;
            if (acc < psVar10) {
              psVar9 = acc;
            }
            psVar6 = (secp256k1_scalar *)0x0;
            if (uVar3 == 0) {
              psVar6 = ng;
            }
            iVar2 = (*pcVar4)(elem,scratch_00,&sStack_12b0,psVar6,cb,cbdata,psVar9,lVar5);
            if (iVar2 == 0) {
              return;
            }
            secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_12b0,(secp256k1_fe *)0x0);
            acc = (secp256k1_sha256 *)((long)acc - (long)psVar9);
            uVar3 = uVar3 + 1;
            lVar5 = (long)psVar10->s + lVar5;
          } while (uStack_1410 != uVar3);
        }
      }
      return;
    }
    sVar7 = 0x41;
  }
  else {
    local_b68[0].magic[0] = '\0';
    sVar7 = 1;
  }
  psStack_bb0 = (secp256k1_strauss_point_state *)0x163703;
  secp256k1_sha256_write(acc,local_b68[0].magic,sVar7);
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &zero);
    secp256k1_ecmult(&rj3, &infj, &zero, x);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj4, x, NULL, NULL, 0);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj5, &zero, test_ecmult_accumulate_cb, (void*)x, 1);
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    ge_equals_gej(&r, &rj2);
    ge_equals_gej(&r, &rj3);
    ge_equals_gej(&r, &rj4);
    ge_equals_gej(&r, &rj5);
    ge_equals_gej(&r, &rj6);
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}